

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O1

get_result * __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::get_internal
          (get_result *__return_storage_ptr__,
          olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this,
          art_key_type k)

{
  _Storage<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false> local_70;
  char local_58;
  undefined1 local_50 [8];
  try_get_result_type result;
  
  result.super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>.
  _M_payload.
  super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
  .super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>._M_payload.
  _M_value.super__Optional_base<unodb::qsbr_ptr_span<const_std::byte>,_false,_false>._M_payload.
  super__Optional_payload<unodb::qsbr_ptr_span<const_std::byte>,_true,_false,_false>.
  super__Optional_payload_base<unodb::qsbr_ptr_span<const_std::byte>_>._M_engaged = false;
  do {
    try_get((try_get_result_type *)&local_70._M_value,this,k);
    std::_Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>::
    _M_move_assign((_Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_> *
                   )local_50,
                   (_Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_> *
                   )&local_70._M_value);
    if ((local_58 == '\x01') &&
       (local_58 = '\0',
       local_70._M_value.super__Optional_base<unodb::qsbr_ptr_span<const_std::byte>,_false,_false>.
       _M_payload.super__Optional_payload<unodb::qsbr_ptr_span<const_std::byte>,_true,_false,_false>
       .super__Optional_payload_base<unodb::qsbr_ptr_span<const_std::byte>_>._M_engaged == true)) {
      local_70._M_value.super__Optional_base<unodb::qsbr_ptr_span<const_std::byte>,_false,_false>.
      _M_payload.super__Optional_payload<unodb::qsbr_ptr_span<const_std::byte>,_true,_false,_false>.
      super__Optional_payload_base<unodb::qsbr_ptr_span<const_std::byte>_>._M_engaged = false;
      detail::qsbr_ptr_base::unregister_active_ptr((void *)local_70._0_8_);
    }
  } while (result.
           super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
           .super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>.
           _M_payload._M_value.
           super__Optional_base<unodb::qsbr_ptr_span<const_std::byte>,_false,_false>._M_payload.
           super__Optional_payload<unodb::qsbr_ptr_span<const_std::byte>,_true,_false,_false>.
           super__Optional_payload_base<unodb::qsbr_ptr_span<const_std::byte>_>._M_engaged != true);
  (__return_storage_ptr__->super__Optional_base<unodb::qsbr_ptr_span<const_std::byte>,_false,_false>
  )._M_payload.super__Optional_payload<unodb::qsbr_ptr_span<const_std::byte>,_true,_false,_false>.
  super__Optional_payload_base<unodb::qsbr_ptr_span<const_std::byte>_>._M_engaged = false;
  if (result.
      super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>.
      _M_payload.
      super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
      .super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>.
      _M_payload._8_1_ == '\x01') {
    *(undefined1 (*) [8])
     &(__return_storage_ptr__->
      super__Optional_base<unodb::qsbr_ptr_span<const_std::byte>,_false,_false>)._M_payload.
      super__Optional_payload<unodb::qsbr_ptr_span<const_std::byte>,_true,_false,_false>.
      super__Optional_payload_base<unodb::qsbr_ptr_span<const_std::byte>_>._M_payload = local_50;
    detail::qsbr_ptr_base::register_active_ptr((void *)local_50);
    (__return_storage_ptr__->
    super__Optional_base<unodb::qsbr_ptr_span<const_std::byte>,_false,_false>)._M_payload.
    super__Optional_payload<unodb::qsbr_ptr_span<const_std::byte>,_true,_false,_false>.
    super__Optional_payload_base<unodb::qsbr_ptr_span<const_std::byte>_>._M_payload._M_value.length
         = result.
           super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
           .super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>.
           _M_payload._0_8_;
    (__return_storage_ptr__->
    super__Optional_base<unodb::qsbr_ptr_span<const_std::byte>,_false,_false>)._M_payload.
    super__Optional_payload<unodb::qsbr_ptr_span<const_std::byte>,_true,_false,_false>.
    super__Optional_payload_base<unodb::qsbr_ptr_span<const_std::byte>_>._M_engaged = true;
  }
  if ((result.
       super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>.
       _M_payload.
       super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
       .super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>.
       _M_payload._M_value.super__Optional_base<unodb::qsbr_ptr_span<const_std::byte>,_false,_false>
       ._M_payload.
       super__Optional_payload<unodb::qsbr_ptr_span<const_std::byte>,_true,_false,_false>.
       super__Optional_payload_base<unodb::qsbr_ptr_span<const_std::byte>_>._M_engaged == true) &&
     (result.
      super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>.
      _M_payload.
      super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
      .super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>.
      _M_payload._M_value.super__Optional_base<unodb::qsbr_ptr_span<const_std::byte>,_false,_false>.
      _M_payload.super__Optional_payload<unodb::qsbr_ptr_span<const_std::byte>,_true,_false,_false>.
      super__Optional_payload_base<unodb::qsbr_ptr_span<const_std::byte>_>._M_engaged = false,
     result.
     super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>.
     _M_payload.
     super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
     .super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>.
     _M_payload._8_1_ == '\x01')) {
    result.super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
    .super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>._M_payload
    ._8_1_ = 0;
    detail::qsbr_ptr_base::unregister_active_ptr((void *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

typename olc_db<Key, Value>::get_result olc_db<Key, Value>::get_internal(
    art_key_type k) const noexcept {
  try_get_result_type result;

  while (true) {
    result = try_get(k);
    if (result) break;
    // TODO(laurynas): upgrade to write locks to prevent starving after a
    // certain number of failures?
  }

  return *result;
}